

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

GPU_Target * GPU_GetWindowTarget(Uint32 windowID)

{
  long lVar1;
  
  if (_gpu_window_mappings == (GPU_WindowMapping *)0x0) {
    _gpu_window_mappings_size = 10;
    _gpu_window_mappings = (GPU_WindowMapping *)SDL_malloc(0xa0);
    _gpu_num_window_mappings = 0;
  }
  if ((windowID != 0) && (0 < (long)_gpu_num_window_mappings)) {
    lVar1 = 0;
    do {
      if (*(Uint32 *)((long)&_gpu_window_mappings->windowID + lVar1) == windowID) {
        return *(GPU_Target **)((long)&_gpu_window_mappings->target + lVar1);
      }
      lVar1 = lVar1 + 0x10;
    } while ((long)_gpu_num_window_mappings * 0x10 != lVar1);
  }
  return (GPU_Target *)0x0;
}

Assistant:

GPU_Target* GPU_GetWindowTarget(Uint32 windowID)
{
    int i;

    if(_gpu_window_mappings == NULL)
        gpu_init_window_mappings();

    if(windowID == 0)  // Invalid window ID
        return NULL;

    // Find the occurrence
    for(i = 0; i < _gpu_num_window_mappings; ++i)
    {
        if(_gpu_window_mappings[i].windowID == windowID)
            return _gpu_window_mappings[i].target;
    }

    return NULL;
}